

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_entropy.c
# Opt level: O3

double * inform_local_transfer_entropy
                   (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,double *te
                   ,inform_error *err)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  double *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  int iVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  size_t sVar10;
  int *piVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  void *pvVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int *piVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int *local_a0;
  
  _Var4 = check_arguments(src,dst,back,l,n,m,b,k,err);
  if (!_Var4) {
    lVar7 = m - k;
    lVar8 = lVar7 * n;
    __ptr = te;
    if ((te != (double *)0x0) || (__ptr = (double *)malloc(lVar8 * 8), __ptr != (double *)0x0)) {
      auVar27._8_4_ = (int)(k >> 0x20);
      auVar27._0_8_ = k;
      auVar27._12_4_ = 0x45300000;
      dVar24 = pow((double)b,
                   (auVar27._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      auVar26._8_4_ = (int)(l >> 0x20);
      auVar26._0_8_ = l;
      auVar26._12_4_ = 0x45300000;
      dVar25 = pow((double)b,
                   (auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)l) - 4503599627370496.0));
      lVar15 = ((long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25) *
               ((long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24);
      lVar22 = (ulong)(uint)(b * b) * lVar15;
      __ptr_00 = calloc(lVar22 + lVar15 + b * lVar15 * 2,4);
      if (__ptr_00 != (void *)0x0) {
        __ptr_01 = malloc(lVar8 * 0x10);
        if (__ptr_01 != (void *)0x0) {
          if (n != 0) {
            lVar3 = lVar15 * 4 + lVar22 * 4;
            lVar15 = b * lVar15 * 4 + lVar3;
            piVar1 = (int *)((long)__ptr_01 + lVar8 * 4);
            piVar2 = piVar1 + lVar8;
            piVar23 = back + (k - 1);
            sVar13 = 0;
            pvVar16 = __ptr_01;
            piVar17 = piVar2 + lVar8;
            piVar18 = piVar2;
            piVar19 = piVar1;
            local_a0 = src;
            do {
              *piVar19 = 0;
              iVar5 = 1;
              if (k != 0) {
                iVar6 = 0;
                sVar10 = 0;
                do {
                  iVar5 = iVar5 * b;
                  iVar6 = iVar6 * b + dst[sVar10];
                  sVar10 = sVar10 + 1;
                } while (k != sVar10);
                *piVar19 = iVar6;
              }
              piVar9 = piVar23;
              sVar10 = k;
              if (k < m) {
                while( true ) {
                  iVar6 = 0;
                  piVar11 = piVar9;
                  sVar14 = l;
                  if (l != 0) {
                    do {
                      iVar6 = iVar6 * b + *piVar11;
                      sVar14 = sVar14 - 1;
                      piVar11 = piVar11 + m * n;
                    } while (sVar14 != 0);
                  }
                  lVar12 = sVar10 - k;
                  iVar20 = iVar6 * iVar5 + piVar19[lVar12];
                  piVar19[lVar12] = iVar20;
                  iVar21 = local_a0[sVar10 - 1];
                  iVar20 = iVar20 * b + dst[sVar10];
                  piVar17[lVar12] = iVar20;
                  *(int *)((long)pvVar16 + lVar12 * 4) = iVar20 * b + iVar21;
                  iVar21 = piVar19[lVar12] * b + iVar21;
                  piVar18[lVar12] = iVar21;
                  piVar11 = (int *)((long)__ptr_00 + (long)*(int *)((long)pvVar16 + lVar12 * 4) * 4)
                  ;
                  *piVar11 = *piVar11 + 1;
                  piVar11 = (int *)((long)__ptr_00 + (long)piVar19[lVar12] * 4 + lVar22 * 4);
                  *piVar11 = *piVar11 + 1;
                  piVar11 = (int *)((long)__ptr_00 + (long)iVar21 * 4 + lVar3);
                  *piVar11 = *piVar11 + 1;
                  iVar21 = piVar17[lVar12];
                  piVar11 = (int *)((long)__ptr_00 + (long)iVar21 * 4 + lVar15);
                  *piVar11 = *piVar11 + 1;
                  sVar10 = sVar10 + 1;
                  if (sVar10 == m) break;
                  piVar19[lVar12 + 1] = iVar21 - (iVar6 * b + dst[lVar12]) * iVar5;
                  piVar9 = piVar9 + 1;
                }
              }
              local_a0 = local_a0 + m;
              dst = dst + m;
              pvVar16 = (void *)((long)pvVar16 + lVar7 * 4);
              piVar19 = piVar19 + lVar7;
              piVar18 = piVar18 + lVar7;
              piVar17 = piVar17 + lVar7;
              sVar13 = sVar13 + 1;
              piVar23 = piVar23 + n;
            } while (sVar13 != n);
            if (lVar8 != 0) {
              lVar7 = 0;
              do {
                dVar24 = log2(((double)*(uint *)((long)__ptr_00 +
                                                (long)piVar1[lVar7] * 4 + lVar22 * 4) *
                              (double)*(uint *)((long)__ptr_00 +
                                               (long)*(int *)((long)__ptr_01 + lVar7 * 4) * 4)) /
                              ((double)*(uint *)((long)__ptr_00 +
                                                (long)(piVar2 + lVar8)[lVar7] * 4 + lVar15) *
                              (double)*(uint *)((long)__ptr_00 + (long)piVar2[lVar7] * 4 + lVar3)));
                __ptr[lVar7] = dVar24;
                lVar7 = lVar7 + 1;
              } while (lVar8 != lVar7);
            }
          }
          free(__ptr_01);
          free(__ptr_00);
          return __ptr;
        }
        if (te == (double *)0x0) {
          free(__ptr);
        }
        free(__ptr_00);
      }
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_transfer_entropy(int const *src, int const *dst,
    int const *back, size_t l, size_t n, size_t m, int b, size_t k, double *te,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate = (te == NULL);
    if (allocate)
    {
        te = malloc(N * sizeof(double));
        if (te == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const q = (size_t) pow((double) b, (double) k);
    size_t const r = (size_t) pow((double) b, (double) l);
    size_t const states_size     = b*b*q*r;
    size_t const histories_size  = q*r;
    size_t const sources_size    = b*q*r;
    size_t const predicates_size = b*q*r;
    size_t const total_size = states_size + histories_size + sources_size + predicates_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states     = { histogram_data, states_size, N };
    inform_dist histories  = { histogram_data + states_size, histories_size, N };
    inform_dist sources    = { histogram_data + states_size + histories_size, sources_size, N };
    inform_dist predicates = { histogram_data + states_size + histories_size + sources_size, predicates_size, N };

    int *state_data = malloc(4 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate) free(te);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state     = state_data;
    int *history   = state + N;
    int *source    = history + N;
    int *predicate = source + N;

    accumulate_local_observations(src, dst, back, l, n, m, b, k, &states,
        &histories, &sources, &predicates, state, history, source, predicate);

    double s, t, u, v;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        t = sources.histogram[source[i]];
        u = predicates.histogram[predicate[i]];
        v = histories.histogram[history[i]];
        te[i] = log2((s*v)/(t*u));
    }

    free(state_data);
    free(histogram_data);

    return te;
}